

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O3

factor * __thiscall
merlin::factor::binaryOp<merlin::factor::binOpPower>
          (double B,factor *__return_storage_ptr__,factor *this)

{
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  
  factor(__return_storage_ptr__,this);
  pdVar1 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    uVar2 = 0;
    do {
      dVar3 = pow(pdVar1[uVar2],B);
      pdVar1[uVar2] = dVar3;
      uVar2 = uVar2 + 1;
      pdVar1 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(__return_storage_ptr__->t_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

factor binaryOp(const value B,
			Function Op) const {
		factor F = *this;
		F.binaryOpIP(B, Op);
		return F; // for scalar args, define with an in-place operator
	}